

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int count_square(MATRIX *matrix,int n,int i,int j)

{
  reference this;
  reference pvVar1;
  undefined4 local_28;
  undefined4 local_24;
  int l;
  int k;
  int n_rows;
  int j_local;
  int i_local;
  int n_local;
  MATRIX *matrix_local;
  
  l = 0;
  for (local_24 = (i / 3) * 3; local_24 < (i / 3) * 3 + 3; local_24 = local_24 + 1) {
    for (local_28 = (j / 3) * 3; local_28 < (j / 3) * 3 + 3; local_28 = local_28 + 1) {
      this = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](matrix,(long)local_24);
      pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](this,(long)local_28);
      if (*pvVar1 == n) {
        l = l + 1;
      }
    }
  }
  return l;
}

Assistant:

int count_square(MATRIX &matrix, int n, int i, int j){
    int n_rows=0;
    for(int k=i/3*3; k<(i/3*3)+3; k++){
        for (int l=j/3*3;l<(j/3*3)+3; l++){
            if (matrix[k][l]==n){
                n_rows++;
            }
        }
    }
    return n_rows;
}